

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfTiledOutputSetFrameBuffer
              (ImfTiledOutputFile *out,ImfRgba *base,size_t xStride,size_t yStride)

{
  ImfTiledOutputFile *in_RDI;
  exception *e;
  size_t in_stack_00000108;
  size_t in_stack_00000110;
  Rgba *in_stack_00000118;
  TiledRgbaOutputFile *in_stack_00000120;
  
  anon_unknown.dwarf_70604::outfile(in_RDI);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
            (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  return 1;
}

Assistant:

int
ImfTiledOutputSetFrameBuffer (
    ImfTiledOutputFile* out,
    const ImfRgba*      base,
    size_t              xStride,
    size_t              yStride)
{
    try
    {
        outfile (out)->setFrameBuffer (
            (OPENEXR_IMF_INTERNAL_NAMESPACE::Rgba*) base, xStride, yStride);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}